

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

bool chaiscript::detail::Dispatch_Engine::function_less_than
               (Proxy_Function *lhs,Proxy_Function *rhs)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  element_type *peVar5;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *this;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *this_00;
  size_type sVar6;
  size_type sVar7;
  const_reference this_01;
  const_reference this_02;
  Type_Info *rt;
  Type_Info *lt;
  size_t i;
  size_type rhssize;
  size_type lhssize;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *rhsparamtypes;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *lhsparamtypes;
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynamic_rhs;
  shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> dynamic_lhs;
  Dynamic_Proxy_Function *in_stack_ffffffffffffff38;
  Type_Info *in_stack_ffffffffffffff48;
  __shared_ptr *this_03;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *in_stack_ffffffffffffff58;
  ulong local_98;
  __shared_ptr local_58 [16];
  __shared_ptr local_48 [16];
  __shared_ptr local_38 [16];
  __shared_ptr local_28 [39];
  byte local_1;
  
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base>
            (in_stack_ffffffffffffff58);
  std::
  dynamic_pointer_cast<chaiscript::dispatch::Dynamic_Proxy_Function_const,chaiscript::dispatch::Proxy_Function_Base>
            (in_stack_ffffffffffffff58);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_28);
  if ((bVar1) && (bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38), bVar1)) {
    std::
    __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x22310a);
    chaiscript::dispatch::Dynamic_Proxy_Function::get_guard(in_stack_ffffffffffffff38);
    bVar2 = std::__shared_ptr::operator_cast_to_bool(local_48);
    std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
              ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x223138);
    if ((bVar2 & 1) == 0) {
      local_1 = 0;
    }
    else {
      std::
      __shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_chaiscript::dispatch::Dynamic_Proxy_Function,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x22314f);
      this_03 = local_58;
      chaiscript::dispatch::Dynamic_Proxy_Function::get_guard(in_stack_ffffffffffffff38);
      bVar1 = std::__shared_ptr::operator_cast_to_bool(this_03);
      local_1 = bVar1 - 1U & 1;
      std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>::~shared_ptr
                ((shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)0x223180);
    }
  }
  else {
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_28);
    if ((!bVar1) || (bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38), bVar1)) {
      bVar1 = std::__shared_ptr::operator_cast_to_bool(local_28);
      if ((bVar1) || (bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38), !bVar1)) {
        peVar5 = std::
                 __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x223221);
        this = chaiscript::dispatch::Proxy_Function_Base::get_param_types(peVar5);
        peVar5 = std::
                 __shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<chaiscript::dispatch::Proxy_Function_Base,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x22323b);
        this_00 = chaiscript::dispatch::Proxy_Function_Base::get_param_types(peVar5);
        sVar6 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                          (this);
        sVar7 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::size
                          (this_00);
        if ((function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
             ::boxed_type == '\0') &&
           (iVar4 = __cxa_guard_acquire(&function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
                                         ::boxed_type), iVar4 != 0)) {
          user_type<chaiscript::Boxed_Value>();
          __cxa_guard_release(&function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
                               ::boxed_type);
        }
        if ((function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
             ::boxed_pod_type == '\0') &&
           (iVar4 = __cxa_guard_acquire(&function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
                                         ::boxed_pod_type), iVar4 != 0)) {
          user_type<chaiscript::Boxed_Number>();
          __cxa_guard_release(&function_less_than(std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>const&)
                               ::boxed_pod_type);
        }
        for (local_98 = 1; local_98 < sVar6 && local_98 < sVar7; local_98 = local_98 + 1) {
          this_01 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                    operator[](this,local_98);
          this_02 = std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::
                    operator[](this_00,local_98);
          bVar1 = Type_Info::bare_equal
                            ((Type_Info *)
                             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                             in_stack_ffffffffffffff48);
          if (!bVar1) {
LAB_002233b4:
            bVar1 = Type_Info::bare_equal
                              ((Type_Info *)
                               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff48);
            if (((!bVar1) || (bVar1 = Type_Info::is_const(this_01), !bVar1)) ||
               (bVar1 = Type_Info::is_const(this_02), bVar1)) {
              bVar1 = Type_Info::bare_equal
                                ((Type_Info *)
                                 CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                                 in_stack_ffffffffffffff48);
              if ((!bVar1) || (bVar1 = Type_Info::is_const(this_01), bVar1)) {
                bVar1 = Type_Info::bare_equal
                                  ((Type_Info *)
                                   CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                                   in_stack_ffffffffffffff48);
                if (bVar1) {
                  local_1 = 0;
                }
                else {
                  bVar1 = Type_Info::bare_equal
                                    ((Type_Info *)
                                     CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
                                     in_stack_ffffffffffffff48);
                  if (bVar1) {
                    bVar1 = Type_Info::bare_equal
                                      ((Type_Info *)
                                       CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50)
                                       ,in_stack_ffffffffffffff48);
                    if (bVar1) {
                      local_1 = 1;
                    }
                    else {
                      local_1 = 1;
                    }
                  }
                  else {
                    bVar1 = Type_Info::bare_equal
                                      ((Type_Info *)
                                       CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50)
                                       ,in_stack_ffffffffffffff48);
                    if (bVar1) {
                      local_1 = 0;
                    }
                    else {
                      bVar1 = Type_Info::bare_equal
                                        ((Type_Info *)
                                         CONCAT17(in_stack_ffffffffffffff57,
                                                  in_stack_ffffffffffffff50),
                                         in_stack_ffffffffffffff48);
                      if (bVar1) {
                        local_1 = 1;
                      }
                      else {
                        local_1 = Type_Info::operator<(this_01,this_02);
                      }
                    }
                  }
                }
              }
              else {
                local_1 = 1;
              }
            }
            else {
              local_1 = 0;
            }
            goto LAB_0022354f;
          }
          bVar1 = Type_Info::is_const(this_01);
          bVar3 = Type_Info::is_const(this_02);
          if (bVar1 != bVar3) goto LAB_002233b4;
        }
        local_1 = 0;
      }
      else {
        local_1 = 1;
      }
    }
    else {
      local_1 = 0;
    }
  }
LAB_0022354f:
  std::shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function>::~shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> *)0x22355c);
  std::shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function>::~shared_ptr
            ((shared_ptr<const_chaiscript::dispatch::Dynamic_Proxy_Function> *)0x223569);
  return (bool)(local_1 & 1);
}

Assistant:

static bool function_less_than(const Proxy_Function &lhs, const Proxy_Function &rhs)
        {

          auto dynamic_lhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(lhs));
          auto dynamic_rhs(std::dynamic_pointer_cast<const dispatch::Dynamic_Proxy_Function>(rhs));

          if (dynamic_lhs && dynamic_rhs)
          {
            if (dynamic_lhs->get_guard())
            {
              return dynamic_rhs->get_guard() ? false : true;
            } else {
              return false;
            }
          }

          if (dynamic_lhs && !dynamic_rhs)
          {
            return false;
          }

          if (!dynamic_lhs && dynamic_rhs)
          {
            return true;
          }

          const auto &lhsparamtypes = lhs->get_param_types();
          const auto &rhsparamtypes = rhs->get_param_types();

          const auto lhssize = lhsparamtypes.size();
          const auto rhssize = rhsparamtypes.size();

#ifdef CHAISCRIPT_HAS_MAGIC_STATICS
          static auto boxed_type = user_type<Boxed_Value>();
          static auto boxed_pod_type = user_type<Boxed_Number>();
#else
          auto boxed_type = user_type<Boxed_Value>();
          auto boxed_pod_type = user_type<Boxed_Number>();
#endif

          for (size_t i = 1; i < lhssize && i < rhssize; ++i)
          {
            const Type_Info &lt = lhsparamtypes[i];
            const Type_Info &rt = rhsparamtypes[i];

            if (lt.bare_equal(rt) && lt.is_const() == rt.is_const())
            {
              continue; // The first two types are essentially the same, next iteration
            }

            // const is after non-const for the same type
            if (lt.bare_equal(rt) && lt.is_const() && !rt.is_const())
            {
              return false;
            }

            if (lt.bare_equal(rt) && !lt.is_const())
            {
              return true;
            }

            // boxed_values are sorted last
            if (lt.bare_equal(boxed_type))
            {
              return false;
            }

            if (rt.bare_equal(boxed_type))
            {
              if (lt.bare_equal(boxed_pod_type))
              {
                return true;
              }
              return true;
            }

            if (lt.bare_equal(boxed_pod_type))
            {
              return false;
            }

            if (rt.bare_equal(boxed_pod_type))
            {
              return true;
            }

            // otherwise, we want to sort by typeid
            return lt < rt;
          }

          return false;
        }